

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServer.cxx
# Opt level: O2

void __thiscall cmDebugServer::ProcessBroadcastQueue(cmDebugServer *this)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  pointer pbVar2;
  
  std::mutex::lock(&this->BroadcastQueueMutex);
  pbVar1 = (this->BroadcastQueue).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (this->BroadcastQueue).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    (*(this->super_cmServerBase)._vptr_cmServerBase[10])(this,pbVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->BroadcastQueue);
  pthread_mutex_unlock((pthread_mutex_t *)&this->BroadcastQueueMutex);
  return;
}

Assistant:

void cmDebugServer::ProcessBroadcastQueue()
{
  std::lock_guard<std::mutex> l(BroadcastQueueMutex);
  for (auto& msg : BroadcastQueue) {
    this->Broadcast(msg);
  }
  this->BroadcastQueue.clear();
}